

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceGroup.cxx
# Opt level: O3

cmSourceGroup * __thiscall cmSourceGroup::MatchChildrenFiles(cmSourceGroup *this,string *name)

{
  pointer pcVar1;
  const_iterator cVar2;
  cmSourceGroup *group;
  pointer this_00;
  
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&(this->GroupFiles)._M_t,name);
  if ((_Rb_tree_header *)cVar2._M_node == &(this->GroupFiles)._M_t._M_impl.super__Rb_tree_header) {
    this_00 = (this->Internal->GroupChildren).
              super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl.
              super__Vector_impl_data._M_start;
    pcVar1 = (this->Internal->GroupChildren).
             super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl.
             super__Vector_impl_data._M_finish;
    while ((this = (cmSourceGroup *)0x0, this_00 != pcVar1 &&
           (this = MatchChildrenFiles(this_00,name), this == (cmSourceGroup *)0x0))) {
      this_00 = this_00 + 1;
    }
  }
  return this;
}

Assistant:

cmSourceGroup* cmSourceGroup::MatchChildrenFiles(const std::string& name)
{
  if (this->MatchesFiles(name)) {
    return this;
  }
  for (cmSourceGroup& group : this->Internal->GroupChildren) {
    cmSourceGroup* result = group.MatchChildrenFiles(name);
    if (result) {
      return result;
    }
  }
  return nullptr;
}